

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# static_analysis.cc
# Opt level: O3

bool tchecker::system::is_deterministic(system_t *system)

{
  uint uVar1;
  long lVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  element_type *peVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  bool bVar4;
  processes_identifiers_range_t pVar5;
  const_iterator cVar6;
  bool bVar7;
  integer_iterator_t<unsigned_int> iVar8;
  process_id_t pid;
  const_iterator_t cVar9;
  range_t<tchecker::system::locs_t::const_iterator_t,_tchecker::system::locs_t::const_iterator_t>
  rVar10;
  range_t<tchecker::system::edges_collection_const_iterator_t,_tchecker::system::edges_collection_const_iterator_t>
  rVar11;
  dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> outevents;
  allocator<unsigned_long> local_59;
  const_iterator_t local_58;
  dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> local_50;
  
  pVar5 = processes_t::processes_identifiers(&system->super_processes_t);
  iVar8 = pVar5._end._current;
  if (pVar5._begin._current._current != iVar8._current) {
    do {
      rVar10 = locs_t::initial_locations(&system->super_locs_t,pVar5._begin._current._current);
      if (0x10 < (long)rVar10._end.super_const_iterator._M_current.super_const_iterator -
                 (long)rVar10._begin.super_const_iterator._M_current) {
        return false;
      }
      pVar5._begin._current = pVar5._begin._current._current + 1;
      pVar5._end._current = 0;
    } while (iVar8._current != pVar5._begin._current);
  }
  boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::dynamic_bitset
            (&local_50,
             ((long)(system->super_events_t)._events_attributes.
                    super__Vector_base<tchecker::system::attributes_t,_std::allocator<tchecker::system::attributes_t>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)(system->super_events_t)._events_attributes.
                    super__Vector_base<tchecker::system::attributes_t,_std::allocator<tchecker::system::attributes_t>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 3) * 0x6db6db6db6db6db7,0,&local_59
            );
  rVar10 = locs_t::locations(&system->super_locs_t);
  bVar7 = true;
  if ((shared_ptr<tchecker::system::loc_t> *)rVar10._begin.super_const_iterator._M_current !=
      rVar10._end.super_const_iterator._M_current.super_const_iterator) {
    do {
      local_58 = rVar10._end.super_const_iterator._M_current;
      cVar9 = rVar10._begin.super_const_iterator._M_current;
      lVar2 = *(long *)cVar9.super_const_iterator._M_current;
      this = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
              ((long)cVar9.super_const_iterator._M_current + 8);
      if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          this->_M_use_count = this->_M_use_count + 1;
          UNLOCK();
        }
        else {
          this->_M_use_count = this->_M_use_count + 1;
        }
      }
      if (local_50.m_bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start !=
          local_50.m_bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        memset(local_50.m_bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
               _M_impl.super__Vector_impl_data._M_start,0,
               (long)local_50.m_bits.
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)local_50.m_bits.
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_start & 0xfffffffffffffff8);
      }
      rVar11 = edges_t::outgoing_edges(&system->super_edges_t,*(loc_id_t *)(lVar2 + 4));
      for (cVar6._M_current =
                (shared_ptr<tchecker::system::edge_t> *)
                rVar11._begin.super_const_iterator._M_current;
          (const_iterator)cVar6._M_current !=
          rVar11._end.super_const_iterator._M_current.super_const_iterator;
          cVar6._M_current = cVar6._M_current + 1) {
        peVar3 = ((cVar6._M_current)->
                 super___shared_ptr<tchecker::system::edge_t,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
        this_00 = ((cVar6._M_current)->
                  super___shared_ptr<tchecker::system::edge_t,_(__gnu_cxx::_Lock_policy)2>).
                  _M_refcount._M_pi;
        if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            this_00->_M_use_count = this_00->_M_use_count + 1;
            UNLOCK();
          }
          else {
            this_00->_M_use_count = this_00->_M_use_count + 1;
          }
        }
        uVar1 = peVar3->_event_id;
        if ((local_50.m_bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
             _M_impl.super__Vector_impl_data._M_start[uVar1 >> 6] >> ((ulong)uVar1 & 0x3f) & 1) != 0
           ) {
          if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
          }
          if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this);
          }
          bVar7 = false;
          goto LAB_0018f3e1;
        }
        local_50.m_bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start[uVar1 >> 6] =
             1L << ((byte)uVar1 & 0x3f) |
             local_50.m_bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
             _M_impl.super__Vector_impl_data._M_start[uVar1 >> 6];
        if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
        }
      }
      if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this);
      }
      rVar10._end.super_const_iterator._M_current = local_58.super_const_iterator._M_current;
      rVar10._begin.super_const_iterator._M_current =
           (const_iterator)(const_iterator)((long)cVar9.super_const_iterator._M_current + 0x10);
    } while ((shared_ptr<tchecker::system::loc_t> *)
             ((long)cVar9.super_const_iterator._M_current + 0x10) !=
             local_58.super_const_iterator._M_current);
    bVar7 = true;
  }
LAB_0018f3e1:
  bVar4 = boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::m_check_invariants
                    (&local_50);
  if (bVar4) {
    if (local_50.m_bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_50.m_bits.
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_50.m_bits.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_50.m_bits.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    return bVar7;
  }
  __assert_fail("m_check_invariants()","/usr/include/boost/dynamic_bitset/dynamic_bitset.hpp",0x2be,
                "boost::dynamic_bitset<>::~dynamic_bitset() [Block = unsigned long, Allocator = std::allocator<unsigned long>]"
               );
}

Assistant:

bool is_deterministic(tchecker::system::system_t const & system)
{
  // Check that each process has only one initial location
  for (tchecker::process_id_t const pid : system.processes_identifiers()) {
    auto initial_locations = system.initial_locations(pid);
    if (std::distance(initial_locations.begin(), initial_locations.end()) > 1)
      return false;
  }

  // Check that every location has at most one outgoing edge for each event
  boost::dynamic_bitset<> outevents(system.events_count(), 0);
  for (tchecker::system::loc_const_shared_ptr_t l : system.locations()) {
    outevents.reset();
    for (tchecker::system::edge_const_shared_ptr_t e : system.outgoing_edges(l->id())) {
      if (outevents[e->event_id()])
        return false;
      outevents[e->event_id()] = 1;
    }
  }
  return true;
}